

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O1

fvar<double,_2UL> * __thiscall
ising::free_energy::square::
infinite<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
          (fvar<double,_2UL> *__return_storage_ptr__,square *this,double Jx,double Jy,
          fvar<double,_2UL> beta)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  double dVar7;
  functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_> f;
  uint uVar8;
  size_t i_3;
  fvar<double,_2UL> *pfVar9;
  long lVar10;
  fvar_t *pfVar11;
  invalid_argument *this_00;
  size_t i_2;
  double *pdVar12;
  size_t i;
  fvar<double,_2UL> *cr;
  fvar<double,_2UL> *cr_00;
  long lVar13;
  fvar<double,_2UL> *cr_01;
  double *pdVar14;
  double *pdVar15;
  long lVar16;
  double *pdVar17;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_2;
  tanh_sinh<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  integrator;
  fvar<double,_2UL> retval_1;
  fvar<double,_2UL> retval_3;
  fvar<double,_2UL> retval;
  fvar<double,_2UL> retval_4;
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> retval_5;
  double local_140 [2];
  undefined1 auStack_130 [16];
  tanh_sinh<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
  local_120;
  double local_110;
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  double dStack_e8;
  double local_e0;
  undefined1 local_d8 [16];
  double local_c8;
  double dStack_c0;
  double local_b8;
  double local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  double local_88 [5];
  undefined8 uStack_60;
  undefined8 uStack_58;
  double local_50;
  undefined8 uStack_48;
  double local_40;
  fvar_t local_38;
  
  if ((Jx <= 0.0) || (Jy <= 0.0)) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Jx and Jy should be positive");
  }
  else {
    if (0.0 < beta.v._M_elems[0]) {
      pdVar12 = local_88;
      local_88[0] = 8.900295434028806e-308;
      local_140[1] = 7.4109846876187e-323;
      local_120.m_imp.
      super___shared_ptr<boost::math::quadrature::detail::tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<boost::math::quadrature::detail::tanh_sinh_detail<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>,std::allocator<boost::math::quadrature::detail::tanh_sinh_detail<double,boost::math::policies::policy<boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy,boost::math::policies::default_policy>>>,unsigned_long&,double_const&>
                (&local_120.m_imp.
                  super___shared_ptr<boost::math::quadrature::detail::tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount,
                 (tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                  **)&local_120,
                 (allocator<boost::math::quadrature::detail::tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>_>
                  *)&local_e0,(unsigned_long *)(local_140 + 1),pdVar12);
      local_140[0] = beta.v._M_elems[0];
      local_c8 = beta.v._M_elems[1];
      dStack_c0 = beta.v._M_elems[2];
      local_88[3] = 0.15915494309189535;
      auVar1._8_4_ = (int)-(ulong)(beta.v._M_elems[2] != 0.0);
      auVar1._0_8_ = -(ulong)(beta.v._M_elems[1] != 0.0);
      auVar1._12_4_ = (int)(-(ulong)(beta.v._M_elems[2] != 0.0) >> 0x20);
      uVar8 = movmskpd(0x6dc9c883,auVar1);
      dVar5 = beta.v._M_elems[1];
      if ((uVar8 & 1) != 0) {
        dVar5 = beta.v._M_elems[1] + beta.v._M_elems[1];
      }
      dVar7 = beta.v._M_elems[2];
      if ((uVar8 & 2) != 0) {
        dVar7 = beta.v._M_elems[2] + beta.v._M_elems[2];
      }
      local_d8._8_4_ = SUB84(dVar7,0);
      local_d8._0_8_ = dVar5;
      local_d8._12_4_ = (int)((ulong)dVar7 >> 0x20);
      local_e0 = (beta.v._M_elems[0] + beta.v._M_elems[0]) * Jx;
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        local_d8._0_8_ = dVar5 * Jx;
      }
      if (dVar7 != 0.0) {
        local_d8._8_8_ = dVar7 * Jx;
      }
      pdVar14 = local_88;
      pfVar9 = boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
                         ((fvar<double,_2UL> *)pdVar14,(detail *)&local_e0,cr);
      auVar2._8_4_ = (int)-(ulong)(dStack_c0 != 0.0);
      auVar2._0_8_ = -(ulong)(local_c8 != 0.0);
      auVar2._12_4_ = (int)(-(ulong)(dStack_c0 != 0.0) >> 0x20);
      uVar8 = movmskpd((int)pfVar9,auVar2);
      dVar5 = local_c8;
      if ((uVar8 & 1) != 0) {
        dVar5 = local_c8 + local_c8;
      }
      local_140[0] = local_140[0] + local_140[0];
      local_98._8_4_ = SUB84(dStack_c0,0);
      local_98._0_8_ = dStack_c0 + dStack_c0;
      local_98._12_4_ = (int)((ulong)dStack_c0 >> 0x20);
      dVar7 = dStack_c0;
      if ((uVar8 & 2) != 0) {
        dVar7 = dStack_c0 + dStack_c0;
      }
      local_108._8_4_ = SUB84(dVar7,0);
      local_108._0_8_ = dVar5;
      local_108._12_4_ = (int)((ulong)dVar7 >> 0x20);
      local_110 = local_140[0] * Jy;
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        local_108._0_8_ = dVar5 * Jy;
      }
      if (dVar7 != 0.0) {
        local_108._8_8_ = dVar7 * Jy;
      }
      local_b8 = local_110;
      boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
                ((fvar<double,_2UL> *)local_f8,(detail *)&local_110,cr_00);
      lVar10 = 2;
      lVar13 = 0;
      do {
        if (local_d8 + lVar10 * -8 + -8 == local_f8) {
          dVar5 = 0.0;
        }
        else {
          dVar5 = 0.0;
          lVar16 = 0;
          pdVar12 = (double *)local_f8;
          do {
            dVar5 = dVar5 + *pdVar12 * *(double *)((long)pdVar14 + lVar16);
            pdVar12 = pdVar12 + 1;
            lVar16 = lVar16 + -8;
          } while (lVar10 * 8 + -0x18 != lVar16);
        }
        *(double *)(auStack_130 + lVar13 * 8 + -8) = dVar5;
        lVar13 = lVar13 + 1;
        bVar18 = lVar10 == 0;
        lVar10 = lVar10 + -1;
        if (bVar18) {
          lVar10 = 0;
        }
        pdVar14 = pdVar14 + 1;
      } while (lVar13 != 3);
      uStack_58 = auStack_130._8_8_;
      local_88[4] = local_140[1];
      uStack_60 = auStack_130._0_8_;
      auVar3._8_4_ = (int)-(ulong)(dStack_c0 != 0.0);
      auVar3._0_8_ = -(ulong)(local_c8 != 0.0);
      auVar3._12_4_ = (int)(-(ulong)(dStack_c0 != 0.0) >> 0x20);
      uVar8 = movmskpd(auStack_130._8_4_,auVar3);
      dVar5 = local_c8;
      if ((uVar8 & 1) != 0) {
        dVar5 = local_c8 + local_c8;
      }
      uVar19 = SUB84(dStack_c0,0);
      uVar20 = (int)((ulong)dStack_c0 >> 0x20);
      if ((uVar8 & 2) != 0) {
        uVar19 = local_98._0_4_;
        uVar20 = local_98._4_4_;
      }
      unique0x1000043f = uVar19;
      local_f8._8_8_ = dVar5;
      unique0x10000443 = uVar20;
      local_f8._0_8_ = local_140[0] * Jx;
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        local_f8._8_8_ = dVar5 * Jx;
      }
      if ((double)CONCAT44(uVar20,uVar19) != 0.0) {
        dStack_e8 = (double)CONCAT44(uVar20,uVar19) * Jx;
      }
      pdVar14 = &local_e0;
      pfVar9 = boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
                         ((fvar<double,_2UL> *)pdVar14,(detail *)local_f8,(fvar<double,_2UL> *)0x3);
      uVar19 = SUB84(dStack_c0,0);
      uVar20 = (undefined4)((ulong)dStack_c0 >> 0x20);
      auVar4._8_4_ = (int)-(ulong)(dStack_c0 != 0.0);
      auVar4._0_8_ = -(ulong)(local_c8 != 0.0);
      auVar4._12_4_ = (int)(-(ulong)(dStack_c0 != 0.0) >> 0x20);
      uVar8 = movmskpd((int)pfVar9,auVar4);
      dVar5 = local_c8;
      if ((uVar8 & 1) != 0) {
        dVar5 = local_c8 + local_c8;
      }
      if ((uVar8 & 2) != 0) {
        uVar19 = local_98._0_4_;
        uVar20 = local_98._4_4_;
      }
      local_a8._8_4_ = uVar19;
      local_a8._0_8_ = dVar5;
      local_a8._12_4_ = uVar20;
      local_b0 = local_b8;
      if ((dVar5 != 0.0) || (NAN(dVar5))) {
        local_a8._0_8_ = dVar5 * Jy;
      }
      if ((double)CONCAT44(uVar20,uVar19) != 0.0) {
        local_a8._8_8_ = (double)CONCAT44(uVar20,uVar19) * Jy;
      }
      boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
                ((fvar<double,_2UL> *)&local_110,(detail *)&local_b0,cr_01);
      lVar10 = 2;
      lVar13 = 0;
      do {
        if ((fvar<double,_2UL> *)(local_f8 + lVar10 * -8) == (fvar<double,_2UL> *)&local_110) {
          dVar5 = 0.0;
        }
        else {
          dVar5 = 0.0;
          lVar16 = 0;
          pdVar12 = &local_110;
          do {
            dVar5 = dVar5 + *pdVar12 * *(double *)((long)pdVar14 + lVar16);
            pdVar12 = pdVar12 + 1;
            lVar16 = lVar16 + -8;
          } while (lVar10 * 8 + -0x18 != lVar16);
        }
        local_88[lVar13] = dVar5;
        lVar13 = lVar13 + 1;
        bVar18 = lVar10 == 0;
        lVar10 = lVar10 + -1;
        if (bVar18) {
          lVar10 = 0;
        }
        pdVar14 = pdVar14 + 1;
      } while (lVar13 != 3);
      local_50 = 1.0 / local_88[0];
      local_140[1] = local_50;
      lVar10 = 1;
      pdVar14 = (double *)0x8;
      do {
        dVar5 = 0.0;
        pdVar15 = pdVar14;
        pdVar17 = local_88;
        do {
          pdVar17 = pdVar17 + 1;
          dVar5 = dVar5 + *pdVar17 * *(double *)((long)local_140 + (long)pdVar15);
          pdVar15 = pdVar15 + -1;
        } while (pdVar15 != (double *)0x0);
        *(double *)(auStack_130 + lVar10 * 8 + -8) = -dVar5 / local_88[0];
        lVar10 = lVar10 + 1;
        pdVar14 = pdVar14 + 1;
      } while (lVar10 != 3);
      local_40 = (double)auStack_130._8_8_;
      uStack_48 = auStack_130._0_8_;
      f.chab_.v._M_elems[0] = local_88[4];
      f.c_ = local_88[3];
      f.chab_.v._M_elems[1] = (double)uStack_60;
      f.chab_.v._M_elems[2] = (double)uStack_58;
      f.k_.v._M_elems[0] = local_50;
      f.k_.v._M_elems[1] = (double)auStack_130._0_8_;
      f.k_.v._M_elems[2] = (double)auStack_130._8_8_;
      pfVar11 = boost::math::quadrature::
                tanh_sinh<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
                ::
                integrate<ising::free_energy::square::(anonymous_namespace)::functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>_>
                          (&local_38,&local_120,f,0.0,1.5707963267948966,1.4901161193847656e-08,
                           pdVar14,(double *)0x3,(size_t *)pdVar12);
      auVar6._8_4_ = (int)-(ulong)(local_38.v._M_elems[2] != 0.0);
      auVar6._0_8_ = -(ulong)(local_38.v._M_elems[1] != 0.0);
      auVar6._12_4_ = (int)(-(ulong)(local_38.v._M_elems[2] != 0.0) >> 0x20);
      uVar8 = movmskpd((int)pfVar11,auVar6);
      if ((uVar8 & 1) != 0) {
        local_38.v._M_elems[1] = local_38.v._M_elems[1] + local_38.v._M_elems[1];
      }
      if ((uVar8 & 2) != 0) {
        local_38.v._M_elems[2] = local_38.v._M_elems[2] + local_38.v._M_elems[2];
      }
      auStack_130._8_4_ = SUB84(local_38.v._M_elems[2],0);
      auStack_130._0_8_ = local_38.v._M_elems[1];
      auStack_130._12_4_ = (int)((ulong)local_38.v._M_elems[2] >> 0x20);
      local_140[1] = local_38.v._M_elems[0] + local_38.v._M_elems[0] + 0.34657359027997264;
      lVar10 = 0;
      do {
        *(ulong *)(auStack_130 + lVar10 + -8) =
             *(ulong *)(auStack_130 + lVar10 + -8) ^ 0x8000000000000000;
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x18);
      (__return_storage_ptr__->v)._M_elems[0] = local_140[1] / beta.v._M_elems[0];
      lVar10 = 1;
      lVar13 = 0x10;
      pdVar12 = (double *)__return_storage_ptr__;
      do {
        dVar5 = 0.0;
        lVar16 = 8;
        pdVar14 = pdVar12;
        do {
          dVar5 = dVar5 + *(double *)((long)beta.v._M_elems + lVar16) * *pdVar14;
          pdVar14 = pdVar14 + -1;
          lVar16 = lVar16 + 8;
        } while (lVar13 != lVar16);
        (__return_storage_ptr__->v)._M_elems[lVar10] =
             (*(double *)(auStack_130 + lVar10 * 8 + -8) - dVar5) / beta.v._M_elems[0];
        lVar10 = lVar10 + 1;
        pdVar12 = pdVar12 + 1;
        lVar13 = 0x18;
      } while (lVar10 != 3);
      if (local_120.m_imp.
          super___shared_ptr<boost::math::quadrature::detail::tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_120.m_imp.
                   super___shared_ptr<boost::math::quadrature::detail::tanh_sinh_detail<double,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      return __return_storage_ptr__;
    }
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"beta should be positive");
  }
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline U infinite(T Jx, T Jy, U beta) {
  const unsigned long max_n = 1 << 16;
  typedef T real_t;
  if (Jx <= 0 || Jy <= 0)
    throw(std::invalid_argument("Jx and Jy should be positive"));
  if (beta <= 0)
    throw(std::invalid_argument("beta should be positive"));
  real_t pi = boost::math::constants::pi<real_t>();
  boost::math::quadrature::tanh_sinh<real_t> integrator;
  auto logZ = log(real_t(2)) / 2 +
              2 * integrator.integrate(func(Jx, Jy, beta), 0, pi / 2);
  return -logZ / beta;
}